

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int within_camp_bounds(uint8_t area,mappos8_t *mappos)

{
  bool local_19;
  bounds_t *bounds;
  mappos8_t *mappos_local;
  uint8_t area_local;
  
  local_19 = false;
  if (((within_camp_bounds::permitted_bounds[area].x0 <= mappos->u) &&
      (local_19 = false, mappos->u < within_camp_bounds::permitted_bounds[area].x1)) &&
     (local_19 = false, within_camp_bounds::permitted_bounds[area].y0 <= mappos->v)) {
    local_19 = mappos->v < within_camp_bounds::permitted_bounds[area].y1;
  }
  return (int)local_19;
}

Assistant:

int within_camp_bounds(uint8_t          area, // ought to be an enum
                       const mappos8_t *mappos)
{
  /**
   * $9F15: Bounds of the three main exterior areas.
   */
  static const bounds_t permitted_bounds[3] =
  {
    { 86, 94, 61, 72 }, /* Corridor to yard */
    { 78,132, 71,116 }, /* Hut area */
    { 79,105, 47, 63 }, /* Yard area */
  };

  const bounds_t *bounds; /* was HL */

  assert(area < NELEMS(permitted_bounds));
  assert(mappos != NULL);

  bounds = &permitted_bounds[area];
  return mappos->u >= bounds->x0 && mappos->u < bounds->x1 &&
         mappos->v >= bounds->y0 && mappos->v < bounds->y1;
}